

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryPopJavascriptArray(ScriptContext *scriptContext,JavascriptArray *arr)

{
  int iVar1;
  ThreadContext *threadContext;
  JavascriptLibrary *pJVar2;
  ScriptContext *objectScriptContext;
  ScriptContext *pSStack_60;
  BOOL gotItem;
  Var element;
  uint32 index;
  uint32 length;
  undefined1 local_40 [8];
  JsReentLock jsReentLock;
  JavascriptArray *arr_local;
  ScriptContext *scriptContext_local;
  
  jsReentLock._24_8_ = arr;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_40,(Var)jsReentLock._24_8_);
  index = *(uint32 *)(jsReentLock._24_8_ + 0x20);
  if (index == 0) {
    pJVar2 = ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)JavascriptLibraryBase::GetUndefined(&pJVar2->super_JavascriptLibraryBase);
  }
  else {
    element._0_4_ = index - 1;
    JsReentLock::unlock((JsReentLock *)local_40);
    iVar1 = (**(code **)(*(long *)jsReentLock._24_8_ + 0x388))
                      (jsReentLock._24_8_,(uint32)element,&stack0xffffffffffffffa0);
    JsReentLock::MutateArrayObject((JsReentLock *)local_40);
    JsReentLock::relock((JsReentLock *)local_40);
    if (iVar1 == 0) {
      pJVar2 = ScriptContext::GetLibrary(scriptContext);
      pSStack_60 = (ScriptContext *)
                   JavascriptLibraryBase::GetUndefined(&pJVar2->super_JavascriptLibraryBase);
    }
    else {
      objectScriptContext =
           RecyclableObject::GetScriptContext((RecyclableObject *)jsReentLock._24_8_);
      pSStack_60 = (ScriptContext *)
                   CrossSite::MarshalVar(scriptContext,pSStack_60,objectScriptContext);
    }
    SetLength((JavascriptArray *)jsReentLock._24_8_,(uint32)element);
    (**(code **)(*(long *)jsReentLock._24_8_ + 0x3a0))();
    scriptContext_local = pSStack_60;
  }
  element._4_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return scriptContext_local;
}

Assistant:

Var JavascriptArray::EntryPopJavascriptArray(ScriptContext * scriptContext, JavascriptArray* arr)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint32 length = arr->length;

        if (length == 0)
        {
            // If length is 0, return 'undefined'
            return scriptContext->GetLibrary()->GetUndefined();
        }

        uint32 index = length - 1;
        Var element;
        JS_REENTRANT(jsReentLock, BOOL gotItem = arr->DirectGetItemAtFull(index, &element));

        if (!gotItem)
        {
            element = scriptContext->GetLibrary()->GetUndefined();
        }
        else
        {
            element = CrossSite::MarshalVar(scriptContext, element, arr->GetScriptContext());
        }
        arr->SetLength(index); // SetLength will clear element at index

#ifdef VALIDATE_ARRAY
        arr->ValidateArray();
#endif
        return element;
    }